

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateScriptRequest,cfd::js::api::json::ScriptDataResponse,cfd::js::api::CreateScriptRequestStruct,cfd::js::api::ScriptDataResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_4c8;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_410 [4];
  JsonClassBase<cfd::js::api::json::ScriptDataResponse> local_3f0 [4];
  undefined1 local_3d0 [8];
  ScriptDataResponse res_2;
  undefined1 local_370 [8];
  ScriptDataResponseStruct response;
  CreateScriptRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_78 [8];
  CreateScriptRequest req;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.items_.
  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)call_function;
  CreateScriptRequest::CreateScriptRequest((CreateScriptRequest *)local_78);
  core::JsonClassBase<cfd::js::api::json::CreateScriptRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::CreateScriptRequest> *)local_78,request_message);
  CreateScriptRequest::ConvertToStruct
            ((CreateScriptRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (CreateScriptRequest *)local_78);
  std::
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
  ::operator()((ScriptDataResponseStruct *)local_370,call_function,
               (CreateScriptRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    ScriptDataResponse::ScriptDataResponse((ScriptDataResponse *)local_3d0);
    ScriptDataResponse::ConvertFromStruct
              ((ScriptDataResponse *)local_3d0,(ScriptDataResponseStruct *)local_370);
    core::JsonClassBase<cfd::js::api::json::ScriptDataResponse>::Serialize_abi_cxx11_(local_3f0);
    std::__cxx11::string::operator=((string *)this,(string *)local_3f0);
    std::__cxx11::string::~string((string *)local_3f0);
    ScriptDataResponse::~ScriptDataResponse((ScriptDataResponse *)local_3d0);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_4c8,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_410);
    std::__cxx11::string::operator=((string *)this,(string *)local_410);
    std::__cxx11::string::~string((string *)local_410);
    ErrorResponse::~ErrorResponse(&local_4c8);
  }
  res_2._87_1_ = 1;
  ScriptDataResponseStruct::~ScriptDataResponseStruct((ScriptDataResponseStruct *)local_370);
  CreateScriptRequestStruct::~CreateScriptRequestStruct
            ((CreateScriptRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  CreateScriptRequest::~CreateScriptRequest((CreateScriptRequest *)local_78);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}